

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

int next_format(png_bytep colour_type,png_bytep bit_depth,uint *palette_number,int low_depth_gray,
               int tRNS)

{
  png_byte pVar1;
  uint uVar2;
  uint uVar3;
  png_byte ct;
  uint pn;
  int tRNS_local;
  int low_depth_gray_local;
  uint *palette_number_local;
  png_bytep bit_depth_local;
  png_bytep colour_type_local;
  
  if (*bit_depth == '\0') {
    *colour_type = '\0';
    if (low_depth_gray == 0) {
      *bit_depth = '\b';
    }
    else {
      *bit_depth = '\x01';
    }
    *palette_number = 0;
    return 1;
  }
  if (*colour_type < 4) {
    uVar2 = *palette_number + 1;
    *palette_number = uVar2;
    pVar1 = *colour_type;
    if ((((pVar1 == '\0') || (pVar1 == '\x02')) && (tRNS != 0)) && (uVar2 < 2)) {
      return 1;
    }
    if (pVar1 == '\x03') {
      uVar3 = 0x10;
      if (4 < *bit_depth) {
        uVar3 = 1;
      }
      if (uVar2 < uVar3) {
        return 1;
      }
    }
    *palette_number = 0;
  }
  *bit_depth = *bit_depth << 1;
  if ((*bit_depth < 9) || ((*colour_type != '\x03' && (*bit_depth < 0x11)))) {
    colour_type_local._4_4_ = 1;
  }
  else {
    switch(*colour_type) {
    case '\0':
      *colour_type = '\x02';
      *bit_depth = '\b';
      colour_type_local._4_4_ = 1;
      break;
    default:
      colour_type_local._4_4_ = 0;
      break;
    case '\x02':
      *colour_type = '\x03';
      *bit_depth = '\x01';
      colour_type_local._4_4_ = 1;
      break;
    case '\x03':
      *colour_type = '\x04';
      *bit_depth = '\b';
      colour_type_local._4_4_ = 1;
      break;
    case '\x04':
      *colour_type = '\x06';
      *bit_depth = '\b';
      colour_type_local._4_4_ = 1;
    }
  }
  return colour_type_local._4_4_;
}

Assistant:

static int
next_format(png_bytep colour_type, png_bytep bit_depth,
   unsigned int* palette_number, int low_depth_gray, int tRNS)
{
   if (*bit_depth == 0)
   {
      *colour_type = 0;
      if (low_depth_gray)
         *bit_depth = 1;
      else
         *bit_depth = 8;
      *palette_number = 0;
      return 1;
   }

   if  (*colour_type < 4/*no alpha channel*/)
   {
      /* Add multiple palettes for colour type 3, one image with tRNS
       * and one without for other non-alpha formats:
       */
      unsigned int pn = ++*palette_number;
      png_byte ct = *colour_type;

      if (((ct == 0/*GRAY*/ || ct/*RGB*/ == 2) && tRNS && pn < 2) ||
          (ct == 3/*PALETTE*/ && pn < PALETTE_COUNT(*bit_depth)))
         return 1;

      /* No: next bit depth */
      *palette_number = 0;
   }

   *bit_depth = (png_byte)(*bit_depth << 1);

   /* Palette images are restricted to 8 bit depth */
   if (*bit_depth <= 8
#ifdef DO_16BIT
         || (*colour_type != 3 && *bit_depth <= 16)
#endif
      )
      return 1;

   /* Move to the next color type, or return 0 at the end. */
   switch (*colour_type)
   {
      case 0:
         *colour_type = 2;
         *bit_depth = 8;
         return 1;

      case 2:
         *colour_type = 3;
         *bit_depth = 1;
         return 1;

      case 3:
         *colour_type = 4;
         *bit_depth = 8;
         return 1;

      case 4:
         *colour_type = 6;
         *bit_depth = 8;
         return 1;

      default:
         return 0;
   }
}